

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuidpp.cpp
# Opt level: O0

string * __thiscall cpuidpp::CPUIDImpl::query_vendor_abi_cxx11_(CPUIDImpl *this)

{
  ulong uVar1;
  pointer info_00;
  ExtractCharsFromArray<1ul,3ul,2ul> local_40 [32];
  undefined1 local_20 [8];
  array<unsigned_int,_4UL> info;
  CPUIDImpl *this_local;
  
  info._M_elems._8_8_ = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    memset(local_20,0,0x10);
    info_00 = std::array<unsigned_int,_4UL>::data((array<unsigned_int,_4UL> *)local_20);
    anon_unknown_138::cpuid(info_00,0);
    (anonymous_namespace)::ExtractCharsFromArray<1ul,3ul,2ul>::extract<unsigned_int,4ul>
              (local_40,(array<unsigned_int,_4UL> *)local_20);
    std::__cxx11::string::operator=((string *)&this->vendor,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return &this->vendor;
}

Assistant:

const std::string& query_vendor() const
    {
        if (vendor.empty()) {
            std::array<unsigned, 4> info{};
            // EAX=0
            cpuid(info.data(), 0);

            vendor = ExtractCharsFromArray<1, 3, 2>::extract(info);
        }

        return vendor;
    }